

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int i;
  long lVar2;
  char *__s1;
  bool bVar3;
  int argc_local;
  
  testing::InitGoogleMock(&argc_local,argv);
  bssl::SetupGoogleTest();
  bVar3 = true;
  argc_local = argc;
  for (lVar2 = 1; lVar2 < argc_local; lVar2 = lVar2 + 1) {
    __s1 = argv[lVar2];
    iVar1 = strcmp(__s1,"--fork_unsafe_buffering");
    if (iVar1 == 0) {
      RAND_enable_fork_unsafe_buffering(-1);
      __s1 = argv[lVar2];
    }
    iVar1 = strcmp(__s1,"--no_unwind_tests");
    bVar3 = (bool)(bVar3 & iVar1 != 0);
  }
  if (bVar3) {
    abi_test::EnableUnwindTests();
  }
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  testing::InitGoogleMock(&argc, argv);
  bssl::SetupGoogleTest();

  bool unwind_tests = true;
  for (int i = 1; i < argc; i++) {
#if !defined(OPENSSL_WINDOWS)
    if (strcmp(argv[i], "--fork_unsafe_buffering") == 0) {
      RAND_enable_fork_unsafe_buffering(-1);
    }
#endif

#if (defined(OPENSSL_ARM) || defined(OPENSSL_AARCH64)) && \
    !defined(OPENSSL_STATIC_ARMCAP)
    if (strncmp(argv[i], "--cpu=", 6) == 0) {
      const char *cpu = argv[i] + 6;
      uint32_t armcap;
      if (strcmp(cpu, "none") == 0) {
        armcap = 0;
      } else if (strcmp(cpu, "neon") == 0) {
        armcap = ARMV7_NEON;
      } else if (strcmp(cpu, "crypto") == 0) {
        armcap = ARMV7_NEON | ARMV8_AES | ARMV8_SHA1 | ARMV8_SHA256 | ARMV8_PMULL;
      } else {
        fprintf(stderr, "Unknown CPU: %s\n", cpu);
        exit(1);
      }

      uint32_t *armcap_ptr = OPENSSL_get_armcap_pointer_for_test();
      if ((armcap & *armcap_ptr) != armcap) {
        fprintf(stderr,
                "Host CPU does not support features for testing CPU '%s'.\n",
                cpu);
        exit(89);
      }
      printf("Simulating CPU '%s'\n", cpu);
      *armcap_ptr = armcap;
    }
#endif  // (ARM || AARCH64) && !STATIC_ARMCAP

    if (strcmp(argv[i], "--no_unwind_tests") == 0) {
      unwind_tests = false;
    }
  }

  if (unwind_tests) {
    abi_test::EnableUnwindTests();
  }

  return RUN_ALL_TESTS();
}